

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rANS_static.c
# Opt level: O1

uchar * rans_compress_O0(uchar *in,uint in_size,uint *out_size)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  ulong uVar15;
  ulong uVar16;
  short sVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  uchar *puVar22;
  uchar *puVar23;
  long lVar24;
  ulong uVar25;
  uint uVar26;
  uchar *puVar27;
  size_t __n;
  uint uVar28;
  short sVar29;
  uint uVar30;
  ulong uVar31;
  long lVar32;
  int iVar33;
  long lVar34;
  byte *pbVar35;
  byte *pbVar36;
  double dVar37;
  int F [256];
  RansEncSymbol syms [256];
  uint local_1438 [256];
  uint local_1038 [3];
  ushort local_102c;
  byte local_102a [4090];
  
  uVar25 = CONCAT44(0,in_size);
  dVar37 = (double)uVar25 * 1.05 + 198147.0 + 9.0;
  uVar21 = (ulong)dVar37;
  puVar22 = (uchar *)malloc((long)(dVar37 - 9.223372036854776e+18) & (long)uVar21 >> 0x3f | uVar21);
  memset(local_1438,0,0x400);
  if (puVar22 == (uchar *)0x0) {
    return (uchar *)0x0;
  }
  if (in_size != 0) {
    uVar21 = 0;
    do {
      local_1438[in[uVar21]] = local_1438[in[uVar21]] + 1;
      uVar21 = uVar21 + 1;
    } while (uVar25 != uVar21);
  }
  puVar23 = puVar22 + (long)(int)((double)uVar25 * 1.05) + 0x3060c;
  uVar31 = 0;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar25;
  uVar21 = 0;
  uVar26 = 0;
  iVar33 = 0;
  do {
    uVar30 = local_1438[uVar31];
    if ((long)(int)uVar30 != 0) {
      uVar18 = uVar26;
      if ((int)uVar26 <= (int)uVar30) {
        uVar18 = uVar30;
      }
      if ((int)uVar26 < (int)uVar30) {
        uVar21 = uVar31 & 0xffffffff;
      }
      uVar26 = (uint)((long)(int)uVar30 *
                      (0x40000000 / (ulong)in_size +
                      SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x80000000000)) / auVar14,0)) >> 0x1f);
      if (uVar26 < 2) {
        uVar26 = 1;
      }
      local_1438[uVar31] = uVar26;
      iVar33 = uVar26 + iVar33;
      uVar26 = uVar18;
    }
    uVar31 = uVar31 + 1;
  } while (uVar31 != 0x100);
  uVar26 = (local_1438[(int)uVar21] - iVar33) + 0xfff;
  local_1438[(int)uVar21] = uVar26;
  if ((int)uVar26 < 1) {
    __assert_fail("F[M]>0",
                  "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/rANS_static.c"
                  ,0x6d,
                  "unsigned char *rans_compress_O0(unsigned char *, unsigned int, unsigned int *)");
  }
  pbVar35 = puVar22 + 9;
  lVar32 = 0;
  uVar21 = 1;
  iVar33 = 0;
  uVar26 = 0;
  do {
    if (local_1438[lVar32] != 0) {
      if (iVar33 == 0) {
        *pbVar35 = (byte)lVar32;
        pbVar36 = pbVar35 + 1;
        iVar33 = 0;
        if ((lVar32 != 0) && (iVar33 = 0, local_1438[lVar32 + -1] != 0)) {
          uVar31 = lVar32 + 1U & 0xffffffff;
          uVar25 = uVar21;
          if (lVar32 != 0xff) {
            do {
              uVar31 = uVar25;
              if (local_1438[uVar31] == 0) goto LAB_00136de1;
              uVar25 = uVar31 + 1;
            } while (uVar31 + 1 != 0x100);
            uVar31 = 0x100;
          }
LAB_00136de1:
          iVar33 = (int)uVar31 - (int)(lVar32 + 1U);
          pbVar35[1] = (byte)iVar33;
          pbVar36 = pbVar35 + 2;
        }
      }
      else {
        iVar33 = iVar33 + -1;
        pbVar36 = pbVar35;
      }
      uVar30 = local_1438[lVar32];
      lVar34 = 1;
      pbVar35 = pbVar36;
      if (0x7f < (int)uVar30) {
        *pbVar36 = (byte)(uVar30 >> 8) | 0x80;
        uVar30 = local_1438[lVar32];
        lVar34 = 2;
        pbVar35 = pbVar36 + 1;
      }
      *pbVar35 = (byte)uVar30;
      if (0x1000 < uVar26) {
        __assert_fail("start <= (1u << scale_bits)",
                      "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/rANS_byte.h"
                      ,0xba,"void RansEncSymbolInit(RansEncSymbol *, uint32_t, uint32_t, uint32_t)")
        ;
      }
      uVar30 = local_1438[lVar32];
      if (0x1000 - uVar26 < uVar30) {
        __assert_fail("freq <= (1u << scale_bits) - start",
                      "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/rANS_byte.h"
                      ,0xbb,"void RansEncSymbolInit(RansEncSymbol *, uint32_t, uint32_t, uint32_t)")
        ;
      }
      lVar24 = lVar32 * 0x10;
      local_1038[lVar32 * 4] = uVar30 << 0x13;
      *(short *)(local_102a + lVar24 + -2) = 0x1000 - (short)uVar30;
      if (uVar30 < 2) {
        local_1038[lVar32 * 4 + 1] = 0xffffffff;
        (local_102a + lVar24)[0] = 0;
        (local_102a + lVar24)[1] = 0;
        uVar18 = uVar26 + 0xfff;
      }
      else {
        sVar17 = 0x1e;
        do {
          sVar29 = sVar17;
          sVar17 = sVar29 + 1;
        } while ((uint)(1 << ((char)sVar29 - 0x1eU & 0x1f)) < uVar30);
        local_1038[lVar32 * 4 + 1] =
             (uint)((((1L << ((byte)(sVar29 + 1) & 0x3f)) + (ulong)uVar30) - 1) / (ulong)uVar30);
        *(short *)(local_102a + lVar24) = sVar29 + -0x1f;
        uVar18 = uVar26;
      }
      local_1038[lVar32 * 4 + 2] = uVar18;
      *(short *)(local_102a + lVar24) = *(short *)(local_102a + lVar24) + 0x20;
      pbVar35 = pbVar36 + lVar34;
      uVar26 = uVar30 + uVar26;
    }
    lVar32 = lVar32 + 1;
    uVar21 = uVar21 + 1;
  } while (lVar32 != 0x100);
  *pbVar35 = 0;
  uVar30 = 0x800000;
  uVar18 = 0x800000;
  uVar19 = 0x800000;
  uVar26 = 0x800000;
  uVar25 = 0x800000;
  uVar31 = 0x800000;
  puVar27 = puVar23;
  uVar21 = 0x800000;
  switch(in_size & 3) {
  case 0:
    goto switchD_00136e38_caseD_0;
  case 1:
    goto switchD_00136e38_caseD_1;
  case 3:
    uVar21 = (ulong)in[in_size - 1];
    uVar26 = local_1038[uVar21 * 4];
    if (uVar26 == 0) goto LAB_001371d6;
    uVar18 = 0x800000;
    if (uVar26 < 0x800001) {
      do {
        puVar27[-1] = (uchar)uVar18;
        puVar27 = puVar27 + -1;
        uVar18 = uVar18 >> 8;
      } while (uVar26 <= uVar18);
    }
    uVar18 = (uint)*(ushort *)(local_102a + uVar21 * 0x10 + -2) *
             (int)((ulong)local_1038[uVar21 * 4 + 1] * (ulong)uVar18 >>
                  (local_102a[uVar21 * 0x10] & 0x3f)) + uVar18 + local_1038[uVar21 * 4 + 2];
  }
  uVar21 = (ulong)in[(in_size - (in_size & 3)) + 1];
  uVar26 = local_1038[uVar21 * 4];
  if (uVar26 != 0) {
    uVar19 = 0x800000;
    if (uVar26 < 0x800001) {
      do {
        puVar27[-1] = (uchar)uVar19;
        puVar27 = puVar27 + -1;
        uVar19 = uVar19 >> 8;
      } while (uVar26 <= uVar19);
    }
    uVar19 = (uint)*(ushort *)(local_102a + uVar21 * 0x10 + -2) *
             (int)((ulong)local_1038[uVar21 * 4 + 1] * (ulong)uVar19 >>
                  (local_102a[uVar21 * 0x10] & 0x3f)) + uVar19 + local_1038[uVar21 * 4 + 2];
    uVar21 = (ulong)uVar18;
switchD_00136e38_caseD_1:
    uVar31 = uVar21;
    uVar21 = (ulong)in[in_size & 0xfffffffc];
    uVar26 = local_1038[uVar21 * 4];
    if (uVar26 != 0) {
      uVar18 = 0x800000;
      if (uVar26 < 0x800001) {
        do {
          puVar27[-1] = (uchar)uVar18;
          puVar27 = puVar27 + -1;
          uVar18 = uVar18 >> 8;
        } while (uVar26 <= uVar18);
      }
      uVar26 = (uint)*(ushort *)(local_102a + uVar21 * 0x10 + -2) *
               (int)((ulong)local_1038[uVar21 * 4 + 1] * (ulong)uVar18 >>
                    (local_102a[uVar21 * 0x10] & 0x3f)) + uVar18 + local_1038[uVar21 * 4 + 2];
      uVar25 = (ulong)uVar19;
switchD_00136e38_caseD_0:
      uVar18 = (uint)uVar25;
      uVar19 = (uint)uVar31;
      if (0 < (int)(in_size & 0xfffffffc)) {
        uVar30 = 0x800000;
        uVar21 = (ulong)(in_size & 0xfffffffc);
        do {
          uVar15 = (ulong)in[uVar21 - 1];
          uVar18 = local_1038[uVar15 * 4];
          if (uVar18 == 0) goto LAB_001371d6;
          bVar1 = in[uVar21 - 2];
          bVar2 = in[uVar21 - 3];
          bVar3 = in[uVar21 - 4];
          for (; uVar18 <= uVar30; uVar30 = uVar30 >> 8) {
            puVar27[-1] = (uchar)uVar30;
            puVar27 = puVar27 + -1;
          }
          uVar18 = local_1038[uVar15 * 4 + 1];
          bVar4 = local_102a[uVar15 * 0x10];
          uVar16 = (ulong)bVar1;
          uVar19 = local_1038[uVar16 * 4];
          if (uVar19 == 0) goto LAB_001371d6;
          uVar8 = local_1038[uVar15 * 4 + 2];
          uVar5 = *(ushort *)(local_102a + uVar15 * 0x10 + -2);
          while (uVar28 = (uint)uVar31, uVar19 <= uVar28) {
            puVar27[-1] = (uchar)uVar31;
            puVar27 = puVar27 + -1;
            uVar31 = (ulong)(uVar28 >> 8);
          }
          uVar19 = local_1038[uVar16 * 4 + 1];
          bVar1 = local_102a[uVar16 * 0x10];
          uVar15 = (ulong)bVar2;
          uVar9 = local_1038[uVar15 * 4];
          if (uVar9 == 0) goto LAB_001371d6;
          uVar10 = local_1038[uVar16 * 4 + 2];
          uVar6 = *(ushort *)(local_102a + uVar16 * 0x10 + -2);
          while (uVar20 = (uint)uVar25, uVar9 <= uVar20) {
            puVar27[-1] = (uchar)uVar25;
            puVar27 = puVar27 + -1;
            uVar25 = (ulong)(uVar20 >> 8);
          }
          uVar9 = local_1038[uVar15 * 4 + 1];
          bVar2 = local_102a[uVar15 * 0x10];
          uVar16 = (ulong)bVar3;
          uVar11 = local_1038[uVar16 * 4];
          if (uVar11 == 0) goto LAB_001371d6;
          uVar12 = local_1038[uVar15 * 4 + 2];
          uVar7 = *(ushort *)(local_102a + uVar15 * 0x10 + -2);
          uVar15 = (ulong)uVar26;
          while (uVar11 <= uVar26) {
            puVar27[-1] = (uchar)uVar15;
            puVar27 = puVar27 + -1;
            uVar26 = (uint)(uVar15 >> 8);
            uVar15 = uVar15 >> 8;
          }
          uVar30 = uVar30 + uVar8 +
                   (int)((ulong)uVar18 * (ulong)uVar30 >> (bVar4 & 0x3f)) * (uint)uVar5;
          uVar19 = uVar28 + uVar10 + (int)(uVar19 * uVar31 >> (bVar1 & 0x3f)) * (uint)uVar6;
          uVar31 = (ulong)uVar19;
          uVar18 = uVar20 + uVar12 + (int)(uVar9 * uVar25 >> (bVar2 & 0x3f)) * (uint)uVar7;
          uVar25 = (ulong)uVar18;
          uVar26 = (int)uVar15 + local_1038[uVar16 * 4 + 2] +
                   (uint)*(ushort *)(local_102a + uVar16 * 0x10 + -2) *
                   (int)(local_1038[uVar16 * 4 + 1] * uVar15 >> (local_102a[uVar16 * 0x10] & 0x3f));
          bVar13 = 4 < (long)uVar21;
          uVar21 = uVar21 - 4;
        } while (bVar13);
      }
      *(uint *)(puVar27 + -4) = uVar30;
      puVar27[-8] = (uchar)uVar19;
      puVar27[-7] = (uchar)(uVar19 >> 8);
      puVar27[-6] = (uchar)(uVar19 >> 0x10);
      puVar27[-5] = (uchar)(uVar19 >> 0x18);
      puVar27[-0xc] = (uchar)uVar18;
      puVar27[-0xb] = (uchar)(uVar18 >> 8);
      puVar27[-10] = (uchar)(uVar18 >> 0x10);
      puVar27[-9] = (uchar)(uVar18 >> 0x18);
      pbVar35 = pbVar35 + (1 - (long)puVar22);
      puVar27[-0x10] = (uchar)uVar26;
      puVar27[-0xf] = (uchar)(uVar26 >> 8);
      puVar27[-0xe] = (uchar)(uVar26 >> 0x10);
      puVar27[-0xd] = (uchar)(uVar26 >> 0x18);
      __n = (long)puVar23 - (long)(puVar27 + -0x10);
      uVar26 = (uint)(pbVar35 + __n);
      *out_size = uVar26;
      *puVar22 = '\0';
      puVar22[1] = (char)(pbVar35 + __n) + 0xf7;
      puVar22[2] = (uchar)(uVar26 + 0xfff7 >> 8);
      puVar22[3] = (uchar)(uVar26 + 0xfffff7 >> 0x10);
      puVar22[4] = (uchar)(uVar26 - 9 >> 0x18);
      puVar22[5] = (uchar)in_size;
      puVar22[6] = (uchar)(in_size >> 8);
      puVar22[7] = (uchar)(in_size >> 0x10);
      puVar22[8] = (uchar)(in_size >> 0x18);
      memmove(puVar22 + (int)pbVar35,puVar27 + -0x10,__n);
      return puVar22;
    }
  }
LAB_001371d6:
  __assert_fail("sym->x_max != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/rANS_byte.h"
                ,0x10f,"void RansEncPutSymbol(RansState *, uint8_t **, const RansEncSymbol *)");
}

Assistant:

unsigned char *rans_compress_O0(unsigned char *in, unsigned int in_size,
				unsigned int *out_size) {
    unsigned char *out_buf = malloc(1.05*in_size + 257*257*3 + 9);
    unsigned char *cp, *out_end;
    RansEncSymbol syms[256];
    RansState rans0, rans1, rans2, rans3;
    uint8_t* ptr;
    int F[256] = {0}, i, j, tab_size, rle, x, fsum = 0;
    int m = 0, M = 0;
    uint64_t tr;

    if (!out_buf)
	return NULL;

    ptr = out_end = out_buf + (int)(1.05*in_size) + 257*257*3 + 9;

    // Compute statistics
    for (i = 0; i < in_size; i++) {
	F[in[i]]++;
    }
    tr = ((uint64_t)TOTFREQ<<31)/in_size + (1<<30)/in_size;

    // Normalise so T[i] == TOTFREQ
    for (m = M = j = 0; j < 256; j++) {
	if (!F[j])
	    continue;

	if (m < F[j])
	    m = F[j], M = j;

	if ((F[j] = (F[j]*tr)>>31) == 0)
	    F[j] = 1;
	fsum += F[j];
    }

    fsum++;
    if (fsum < TOTFREQ)
	F[M] += TOTFREQ-fsum;
    else
	F[M] -= fsum-TOTFREQ;

    //printf("F[%d]=%d\n", M, F[M]);
    assert(F[M]>0);

    // Encode statistics.
    cp = out_buf+9;

    for (x = rle = j = 0; j < 256; j++) {
	if (F[j]) {
	    // j
	    if (rle) {
		rle--;
	    } else {
		*cp++ = j;
		if (!rle && j && F[j-1])  {
		    for(rle=j+1; rle<256 && F[rle]; rle++)
			;
		    rle -= j+1;
		    *cp++ = rle;
		}
		//fprintf(stderr, "%d: %d %d\n", j, rle, N[j]);
	    }

	    // F[j]
	    if (F[j]<128) {
		*cp++ = F[j];
	    } else {
		*cp++ = 128 | (F[j]>>8);
		*cp++ = F[j]&0xff;
	    }
	    RansEncSymbolInit(&syms[j], x, F[j], TF_SHIFT);
	    x += F[j];
	}
    }
    *cp++ = 0;

    //write(1, out_buf+4, cp-(out_buf+4));
    tab_size = cp-out_buf;

    RansEncInit(&rans0);
    RansEncInit(&rans1);
    RansEncInit(&rans2);
    RansEncInit(&rans3);

    switch (i=(in_size&3)) {
    case 3: RansEncPutSymbol(&rans2, &ptr, &syms[in[in_size-(i-2)]]);
    case 2: RansEncPutSymbol(&rans1, &ptr, &syms[in[in_size-(i-1)]]);
    case 1: RansEncPutSymbol(&rans0, &ptr, &syms[in[in_size-(i-0)]]);
    case 0:
	break;
    }
    for (i=(in_size &~3); i>0; i-=4) {
	RansEncSymbol *s3 = &syms[in[i-1]];
	RansEncSymbol *s2 = &syms[in[i-2]];
	RansEncSymbol *s1 = &syms[in[i-3]];
	RansEncSymbol *s0 = &syms[in[i-4]];

	RansEncPutSymbol(&rans3, &ptr, s3);
	RansEncPutSymbol(&rans2, &ptr, s2);
	RansEncPutSymbol(&rans1, &ptr, s1);
	RansEncPutSymbol(&rans0, &ptr, s0);
    }

    RansEncFlush(&rans3, &ptr);
    RansEncFlush(&rans2, &ptr);
    RansEncFlush(&rans1, &ptr);
    RansEncFlush(&rans0, &ptr);

    // Finalise block size and return it
    *out_size = (out_end - ptr) + tab_size;

    cp = out_buf;

    *cp++ = 0; // order
    *cp++ = ((*out_size-9)>> 0) & 0xff;
    *cp++ = ((*out_size-9)>> 8) & 0xff;
    *cp++ = ((*out_size-9)>>16) & 0xff;
    *cp++ = ((*out_size-9)>>24) & 0xff;

    *cp++ = (in_size>> 0) & 0xff;
    *cp++ = (in_size>> 8) & 0xff;
    *cp++ = (in_size>>16) & 0xff;
    *cp++ = (in_size>>24) & 0xff;

    memmove(out_buf + tab_size, ptr, out_end-ptr);

    return out_buf;
}